

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-alloc.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  time_t tVar4;
  long lVar5;
  undefined8 uVar6;
  ggml_cgraph *pgVar7;
  id *piVar8;
  mapped_type *pmVar9;
  size_t __i;
  long lVar10;
  int32_t iVar11;
  ggml_gallocr_t allocr;
  ulong uVar12;
  id *piVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  id id;
  vector<int,_std::allocator<int>_> embd;
  vector<int,_std::allocator<int>_> embd_inp;
  vector<float,_std::allocator<float>_> logits;
  gpt_params params;
  gpt_vocab vocab;
  mt19937 rng;
  float local_1620;
  key_type local_161c;
  vector<int,_std::allocator<int>_> local_1618;
  undefined8 local_1600;
  vector<int,_std::allocator<int>_> local_15f8;
  long local_15e0;
  undefined8 local_15d8;
  float local_15d0;
  float local_15cc;
  vector<float,_std::allocator<float>_> local_15c8;
  ggml_gallocr_t local_15a8;
  long local_15a0;
  long local_1598;
  long local_1590;
  long local_1588;
  gpt_params local_1580;
  gpt_vocab local_14e0;
  undefined1 local_1468 [72];
  pointer local_1420;
  pointer pgStack_1418;
  pointer local_1410;
  ggml_context *local_13f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
  local_13f0;
  mt19937 local_13b8;
  
  ggml_time_init();
  lVar3 = ggml_time_us();
  gpt_params::gpt_params(&local_1580);
  std::__cxx11::string::_M_replace
            ((ulong)&local_1580.model,0,(char *)local_1580.model._M_string_length,0x120490);
  bVar1 = gpt_params_parse(argc,argv,&local_1580);
  iVar2 = 1;
  if (bVar1) {
    if (local_1580.seed < 0) {
      tVar4 = time((time_t *)0x0);
      local_1580.seed = (int32_t)tVar4;
    }
    printf("%s: seed = %d\n","main");
    local_13b8._M_x[0] = (unsigned_long)(uint)local_1580.seed;
    lVar10 = 1;
    uVar14 = local_13b8._M_x[0];
    do {
      uVar14 = (ulong)(((uint)(uVar14 >> 0x1e) ^ (uint)uVar14) * 0x6c078965 + (int)lVar10);
      local_13b8._M_x[lVar10] = uVar14;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x270);
    local_13b8._M_p = 0x270;
    if (local_1580.prompt._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1468,&local_13b8);
      std::__cxx11::string::operator=((string *)&local_1580.prompt,(string *)local_1468);
      if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
        operator_delete((void *)local_1468._0_8_,local_1468._16_8_ + 1);
      }
    }
    local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_14e0.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_14e0.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_14e0.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_13f0._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_13f0._M_impl.super__Rb_tree_header._M_header;
    local_1468._0_8_ = (pointer)0x4000000c451;
    local_1468._8_8_ = 0xc00000300;
    local_1468._16_8_ = 0x10000000c;
    local_1468._24_4_ = 0x3727c5ac;
    local_1420 = (pointer)0x0;
    pgStack_1418 = (pointer)0x0;
    local_1410 = (pointer)0x0;
    local_13f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_13f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_13f0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_14e0.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_14e0.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_13f0._M_impl.super__Rb_tree_header._M_header._M_right =
         local_13f0._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar10 = ggml_time_us();
    bVar1 = gpt2_model_load(&local_1580.model,(gpt2_model *)local_1468,&local_14e0);
    if (bVar1) {
      lVar5 = ggml_time_us();
      test_gpt_tokenizer(&local_14e0,&local_1580.token_test);
      uVar6 = ggml_backend_cpu_buffer_type();
      local_15a8 = (ggml_gallocr_t)ggml_gallocr_new(uVar6);
      iVar11 = local_1580.n_batch;
      if ((int)local_1468._4_4_ <= local_1580.n_batch) {
        iVar11 = local_1468._4_4_;
      }
      pgVar7 = gpt2_graph((gpt2_model *)local_1468,local_1468._4_4_ - iVar11,iVar11);
      ggml_gallocr_reserve(local_15a8,pgVar7);
      uVar6 = ggml_gallocr_get_buffer_size(local_15a8,0);
      auVar16._8_4_ = (int)((ulong)uVar6 >> 0x20);
      auVar16._0_8_ = uVar6;
      auVar16._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              SUB84(((auVar16._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 0.0009765625 *
                    0.0009765625,0),"main");
      local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      gpt_tokenize(&local_15f8,&local_14e0,&local_1580.prompt);
      iVar2 = local_1468._4_4_ -
              (int)((ulong)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      if (local_1580.n_predict <= iVar2) {
        iVar2 = local_1580.n_predict;
      }
      local_1580.n_predict = iVar2;
      printf("%s: prompt: \'%s\'\n","main",local_1580.prompt._M_dataplus._M_p);
      printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
             (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
      if (0 < (int)((ulong)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2)) {
        lVar15 = 0;
        do {
          printf("%d ",(ulong)(uint)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start[lVar15]);
          lVar15 = lVar15 + 1;
          iVar2 = (int)((ulong)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2);
          if (7 < iVar2) {
            iVar2 = 8;
          }
        } while (lVar15 < iVar2);
      }
      puts("\n");
      local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (id *)0x0;
      local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (id *)0x0;
      local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      local_1620 = 0.0;
      local_1600 = (ulong)local_1600._4_4_ << 0x20;
      local_15d8 = (ulong)local_15d8._4_4_ << 0x20;
      if ((long)local_1580.n_predict +
          ((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) != 0) {
        iVar2 = 0;
        local_1600 = 0;
        uVar14 = 0;
        local_15e0 = 0;
        allocr = local_15a8;
        local_15a0 = lVar5;
        local_1598 = lVar10;
        local_1590 = lVar3;
        do {
          if (local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar3 = ggml_time_us();
            gpt2_eval((gpt2_model *)local_1468,allocr,local_1580.n_threads,iVar2,&local_1618,
                      &local_15c8);
            lVar10 = ggml_time_us();
            local_15e0 = (local_15e0 - lVar3) + lVar10;
          }
          iVar11 = local_1580.top_k;
          local_15d8 = (long)local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
          if (local_15d8 != 0) {
            local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          if (uVar14 < (ulong)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 2)) {
            lVar3 = uVar14 * 4;
            piVar8 = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = uVar14;
            do {
              if (local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_1618,
                           (iterator)
                           local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,
                           (int *)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar3));
                piVar8 = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              else {
                *local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     *(int *)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start + lVar3);
                local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              if (local_1580.n_batch <=
                  (int)((ulong)((long)local_1618.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar8) >> 2
                       )) break;
              uVar12 = uVar12 + 1;
              lVar3 = lVar3 + 4;
            } while (uVar12 < (ulong)((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 2));
            uVar14 = (uVar14 + ((long)local_1618.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar8 >> 2)
                     ) - 1;
            piVar13 = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar8 = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            allocr = local_15a8;
          }
          else {
            local_15cc = local_1580.top_p;
            local_15d0 = local_1580.temp;
            lVar3 = (long)(int)local_1468._0_4_;
            local_161c = 0;
            local_1588 = ggml_time_us();
            local_161c = gpt_sample_top_k_top_p
                                   (&local_14e0,
                                    local_15c8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start +
                                    (((ulong)((long)local_15c8.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_15c8.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_start) >> 2)
                                    - lVar3),iVar11,(double)local_15cc,(double)local_15d0,
                                    &local_13b8);
            lVar3 = ggml_time_us();
            if (local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_1618,
                         (iterator)
                         local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_161c);
            }
            else {
              *local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_161c;
              local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_1600 = (local_1600 - local_1588) + lVar3;
            piVar13 = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar8 = local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          for (; piVar13 != piVar8; piVar13 = piVar13 + 1) {
            local_161c = *piVar13;
            pmVar9 = std::
                     map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&local_14e0.id_to_token,&local_161c);
            printf("%s",(pmVar9->_M_dataplus)._M_p);
          }
          iVar2 = iVar2 + (int)(local_15d8 >> 2);
          fflush(_stdout);
        } while ((local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1] != 0xc450) &&
                (uVar14 = uVar14 + 1,
                uVar14 < (ulong)((long)local_1580.n_predict +
                                ((long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 2))));
        local_1600 = CONCAT44(local_1600._4_4_,(float)local_1600);
        local_1620 = (float)local_15e0;
        local_15d8 = CONCAT44(local_15d8._4_4_,(float)iVar2);
        lVar3 = local_1590;
        lVar5 = local_15a0;
        lVar10 = local_1598;
      }
      lVar15 = ggml_time_us();
      local_15e0 = CONCAT44(local_15e0._4_4_,(float)(lVar5 - lVar10));
      puts("\n");
      printf("%s:     load time = %8.2f ms\n",SUB84((double)((float)local_15e0 / 1000.0),0),"main");
      printf("%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_1600 / 1000.0),0),"main");
      printf("%s:  predict time = %8.2f ms / %.2f ms per token\n",
             SUB84((double)(local_1620 / 1000.0),0),
             (double)((local_1620 / 1000.0) / (float)local_15d8),"main");
      printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar15 - lVar3) / 1000.0),0),
             "main");
      ggml_free(local_13f8);
      if (local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (id *)0x0) {
        operator_delete(local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1618.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_15f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_15c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar2 = 0;
    }
    else {
      main_cold_1();
      iVar2 = 1;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_tensor_*>_>_>
    ::~_Rb_tree(&local_13f0);
    if (local_1420 != (pointer)0x0) {
      operator_delete(local_1420,(long)local_1410 - (long)local_1420);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_14e0.special_tokens);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_14e0.id_to_token._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)&local_14e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1580.token_test._M_dataplus._M_p != &local_1580.token_test.field_2) {
    operator_delete(local_1580.token_test._M_dataplus._M_p,
                    local_1580.token_test.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1580.prompt._M_dataplus._M_p != &local_1580.prompt.field_2) {
    operator_delete(local_1580.prompt._M_dataplus._M_p,
                    local_1580.prompt.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1580.model._M_dataplus._M_p != &local_1580.model.field_2) {
    operator_delete(local_1580.model._M_dataplus._M_p,
                    local_1580.model.field_2._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;
    params.model = "models/gpt-2-117M/ggml-model.bin";

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    ggml_gallocr_t allocr = NULL;
    // allocate the compute buffer
    {
        allocr = ggml_gallocr_new(ggml_backend_cpu_buffer_type());

        // create the worst case graph for memory usage estimation
        int n_tokens = std::min(model.hparams.n_ctx, params.n_batch);
        int n_past = model.hparams.n_ctx - n_tokens;
        struct ggml_cgraph * gf = gpt2_graph(model, n_past, n_tokens);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size =  ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    // submit the input prompt token-by-token
    // this reduces the memory usage during inference, at the cost of a bit of speed at the beginning
    std::vector<gpt_vocab::id> embd;

    for (size_t i = embd.size(); i < embd_inp.size() + params.n_predict; i++) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!gpt2_eval(model, allocr, params.n_threads, n_past, embd, logits)) {
                printf("Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (i >= embd_inp.size()) {
            // sample next token
            const int   top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits.data() + (logits.size() - n_vocab), top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);
        } else {
            // if here, it means we are still processing the input prompt
            for (size_t k = i; k < embd_inp.size(); k++) {
                embd.push_back(embd_inp[k]);
                if (int32_t(embd.size()) >= params.n_batch) {
                    break;
                }
            }
            i += embd.size() - 1;
        }

        // display text
        for (auto id : embd) {
            printf("%s", vocab.id_to_token[id].c_str());
        }
        fflush(stdout);

        // end of text token
        if (embd.back() == 50256) {
            break;
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx_w);

    return 0;
}